

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustnessTests.cpp
# Opt level: O3

string * __thiscall
es32cts::RobustBufferAccessBehavior::GetnUniformTest::getComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,GetnUniformTest *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 320 es\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 11) uniform vec4 inputf;\nlayout (location = 12) uniform ivec3 inputi;\nlayout (location = 13) uniform uvec4 inputu;\n\nshared float valuef;\nshared int valuei;\nshared uint valueu;\n\nvoid main()\n{\n   valuef = inputf.r + inputf.g + inputf.b + inputf.a;\n   valuei = inputi.r + inputi.g + inputi.b;\n   valueu = inputu.r + inputu.g + inputu.b + inputu.a;\n}\n\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string GetnUniformTest::getComputeShader()
{
	static const GLchar* cs = "#version 320 es\n"
							  "\n"
							  "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							  "\n"
							  "layout (location = 11) uniform vec4 inputf;\n"
							  "layout (location = 12) uniform ivec3 inputi;\n"
							  "layout (location = 13) uniform uvec4 inputu;\n"
							  "\n"
							  "shared float valuef;\n"
							  "shared int valuei;\n"
							  "shared uint valueu;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "   valuef = inputf.r + inputf.g + inputf.b + inputf.a;\n"
							  "   valuei = inputi.r + inputi.g + inputi.b;\n"
							  "   valueu = inputu.r + inputu.g + inputu.b + inputu.a;\n"
							  "}\n"
							  "\n";

	std::string source = cs;

	return source;
}